

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O2

void __thiscall
cbtQuantizedBvh::setQuantizationValues
          (cbtQuantizedBvh *this,cbtVector3 *bvhAabbMin,cbtVector3 *bvhAabbMax,
          cbtScalar quantizationMargin)

{
  cbtVector3 *v2;
  cbtVector3 *v1;
  undefined8 uVar9;
  undefined1 auVar1 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar2 [64];
  undefined1 auVar10 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar13 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  cbtVector3 cVar18;
  cbtVector3 cVar19;
  unsigned_short vecIn [3];
  cbtVector3 local_58;
  cbtVector3 local_48;
  
  auVar13 = in_ZMM1._8_56_;
  auVar2._4_60_ = in_register_00001204;
  auVar2._0_4_ = quantizationMargin;
  local_48.m_floats = (cbtScalar  [4])vpshufb_avx(auVar2._0_16_,_DAT_00f5c6f0);
  auVar10 = ZEXT856(local_48.m_floats._8_8_);
  cVar18 = ::operator-(bvhAabbMin,&local_48);
  auVar11._0_8_ = cVar18.m_floats._8_8_;
  auVar11._8_56_ = auVar13;
  auVar3._0_8_ = cVar18.m_floats._0_8_;
  auVar3._8_56_ = auVar10;
  auVar1 = vpunpcklqdq_avx(auVar3._0_16_,auVar11._0_16_);
  auVar10 = ZEXT856(auVar1._8_8_);
  v2 = &this->m_bvhAabbMin;
  *(undefined1 (*) [16])(this->m_bvhAabbMin).m_floats = auVar1;
  cVar18 = ::operator+(bvhAabbMax,&local_48);
  auVar12._0_8_ = cVar18.m_floats._8_8_;
  auVar12._8_56_ = auVar13;
  auVar4._0_8_ = cVar18.m_floats._0_8_;
  auVar4._8_56_ = auVar10;
  v1 = &this->m_bvhAabbMax;
  auVar1 = vpunpcklqdq_avx(auVar4._0_16_,auVar12._0_16_);
  auVar10 = ZEXT856(auVar1._8_8_);
  *(undefined1 (*) [16])(this->m_bvhAabbMax).m_floats = auVar1;
  cVar18 = ::operator-(v1,v2);
  auVar5._0_8_ = cVar18.m_floats._0_8_;
  auVar5._8_56_ = auVar10;
  auVar14._8_4_ = 0x477ffd00;
  auVar14._0_8_ = 0x477ffd00477ffd00;
  auVar14._12_4_ = 0x477ffd00;
  auVar1 = vdivps_avx(auVar14,auVar5._0_16_);
  auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)(65533.0 / cVar18.m_floats[2])),0x28);
  auVar10 = ZEXT856(auVar1._8_8_);
  *(undefined1 (*) [16])(this->m_bvhQuantization).m_floats = auVar1;
  this->m_useQuantization = true;
  quantize(this,vecIn,v2,0);
  cVar19 = unQuantize(this,vecIn);
  cVar18.m_floats = local_48.m_floats;
  auVar6._0_8_ = cVar19.m_floats._0_8_;
  auVar6._8_56_ = auVar10;
  auVar15._8_8_ = 0;
  auVar15._0_4_ = local_48.m_floats[0];
  auVar15._4_4_ = local_48.m_floats[1];
  local_48.m_floats[2] = cVar18.m_floats[2];
  auVar1 = vsubps_avx(auVar6._0_16_,auVar15);
  local_58.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar1,ZEXT416((uint)(cVar19.m_floats[2] - local_48.m_floats[2])),0x28);
  auVar10 = ZEXT856(local_58.m_floats._8_8_);
  local_48.m_floats = cVar18.m_floats;
  cbtVector3::setMin(v2,&local_58);
  cVar18 = ::operator-(v1,v2);
  auVar7._0_8_ = cVar18.m_floats._0_8_;
  auVar7._8_56_ = auVar10;
  auVar16._8_4_ = 0x477ffd00;
  auVar16._0_8_ = 0x477ffd00477ffd00;
  auVar16._12_4_ = 0x477ffd00;
  auVar1 = vdivps_avx(auVar16,auVar7._0_16_);
  auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)(65533.0 / cVar18.m_floats[2])),0x28);
  uVar9 = auVar1._8_8_;
  *(undefined1 (*) [16])(this->m_bvhQuantization).m_floats = auVar1;
  quantize(this,vecIn,v1,1);
  cVar18 = unQuantize(this,vecIn);
  auVar1._0_4_ = cVar18.m_floats[0] + local_48.m_floats[0];
  auVar1._4_4_ = cVar18.m_floats[1] + local_48.m_floats[1];
  auVar1._8_4_ = (float)uVar9 + 0.0;
  auVar1._12_4_ = (float)((ulong)uVar9 >> 0x20) + 0.0;
  local_58.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar1,ZEXT416((uint)(cVar18.m_floats[2] + local_48.m_floats[2])),0x28);
  auVar10 = ZEXT856(local_58.m_floats._8_8_);
  cbtVector3::setMax(v1,&local_58);
  cVar18 = ::operator-(v1,v2);
  auVar8._0_8_ = cVar18.m_floats._0_8_;
  auVar8._8_56_ = auVar10;
  auVar17._8_4_ = 0x477ffd00;
  auVar17._0_8_ = 0x477ffd00477ffd00;
  auVar17._12_4_ = 0x477ffd00;
  auVar1 = vdivps_avx(auVar17,auVar8._0_16_);
  auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)(65533.0 / cVar18.m_floats[2])),0x28);
  *(undefined1 (*) [16])(this->m_bvhQuantization).m_floats = auVar1;
  return;
}

Assistant:

void cbtQuantizedBvh::setQuantizationValues(const cbtVector3& bvhAabbMin, const cbtVector3& bvhAabbMax, cbtScalar quantizationMargin)
{
	//enlarge the AABB to avoid division by zero when initializing the quantization values
	cbtVector3 clampValue(quantizationMargin, quantizationMargin, quantizationMargin);
	m_bvhAabbMin = bvhAabbMin - clampValue;
	m_bvhAabbMax = bvhAabbMax + clampValue;
	cbtVector3 aabbSize = m_bvhAabbMax - m_bvhAabbMin;
	m_bvhQuantization = cbtVector3(cbtScalar(65533.0), cbtScalar(65533.0), cbtScalar(65533.0)) / aabbSize;

	m_useQuantization = true;

	{
		unsigned short vecIn[3];
		cbtVector3 v;
		{
			quantize(vecIn, m_bvhAabbMin, false);
			v = unQuantize(vecIn);
			m_bvhAabbMin.setMin(v - clampValue);
		}
		aabbSize = m_bvhAabbMax - m_bvhAabbMin;
		m_bvhQuantization = cbtVector3(cbtScalar(65533.0), cbtScalar(65533.0), cbtScalar(65533.0)) / aabbSize;
		{
			quantize(vecIn, m_bvhAabbMax, true);
			v = unQuantize(vecIn);
			m_bvhAabbMax.setMax(v + clampValue);
		}
		aabbSize = m_bvhAabbMax - m_bvhAabbMin;
		m_bvhQuantization = cbtVector3(cbtScalar(65533.0), cbtScalar(65533.0), cbtScalar(65533.0)) / aabbSize;
	}
}